

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

RepliStruct * __thiscall r_comp::RepliStruct::printError_abi_cxx11_(RepliStruct *this)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  reference psVar4;
  long in_RSI;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  Ptr arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range1;
  RepliStruct *structure;
  string local_1c0 [8];
  string com;
  stringstream local_1a0 [8];
  stringstream strError;
  ostream local_190 [384];
  RepliStruct *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::__cxx11::string::string(local_1c0,(string *)(in_RSI + 8));
    for (__range1 = *(vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      **)(in_RSI + 200); lVar2 = std::__cxx11::string::size(),
        lVar2 == 0 &&
        __range1 !=
        (vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         *)0x0; __range1 = (vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                            *)__range1[8].
                              super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::operator=
                (local_1c0,
                 (string *)
                 &(__range1->
                  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      std::operator<<(local_190,"Error");
    }
    else {
      poVar3 = std::operator<<(local_190,"Error in structure \'");
      poVar3 = std::operator<<(poVar3,local_1c0);
      std::operator<<(poVar3,"\'");
    }
    if (*(long *)(in_RSI + 0xa8) != 0) {
      poVar3 = std::operator<<(local_190," line ");
      std::ostream::operator<<(poVar3,*(ulong *)(in_RSI + 0xa8));
    }
    poVar3 = std::operator<<(local_190,": ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 0x68));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1c0);
  }
  __end1 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    *)(in_RSI + 0xb0));
  arg.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
       ::end((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              *)(in_RSI + 0xb0));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                     *)&arg.
                                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar4 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_200,psVar4);
    std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )local_200);
    printError_abi_cxx11_((RepliStruct *)local_220);
    std::operator<<(local_190,(string *)local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_200);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string RepliStruct::printError() const
{
    std::stringstream strError;

    if (error.size() > 0) {
        std::string com = cmd;
        RepliStruct* structure = parent;

        while ((cmd.size() == 0) && (structure != nullptr)) {
            com = structure->cmd;
            structure = structure->parent;
        }

        if (com.size() == 0) {
            strError << "Error";
        } else {
            strError << "Error in structure '" << com << "'";
        }

        if (line > 0) {
            strError << " line " << line;
        }

        strError << ": " << error << std::endl;
    }

    for (RepliStruct::Ptr arg : args) {
        strError << arg->printError();
    }

    return strError.str();
}